

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt4AddClampPalCommand::Execute
          (DrawColumnRt4AddClampPalCommand *this,DrawerThread *thread)

{
  uint8_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t b;
  uint32_t a;
  uint32_t *bg2rgb;
  uint32_t *fg2rgb;
  int count;
  int pitch;
  uint8_t *dest;
  uint8_t *source;
  uint8_t *colormap;
  DrawerThread *thread_local;
  DrawColumnRt4AddClampPalCommand *this_local;
  
  fg2rgb._0_4_ = DrawerThread::count_for_thread
                           (thread,(this->super_PalRtCommand).yl,
                            ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < (int)fg2rgb) {
    iVar5 = (this->super_PalRtCommand).yl;
    iVar4 = DrawerThread::skipped_by_thread(thread,(this->super_PalRtCommand).yl);
    _count = (this->super_PalRtCommand)._destorg +
             (*(int *)(ylookup + (long)(iVar5 + iVar4) * 4) + (this->super_PalRtCommand).sx);
    puVar1 = thread->dc_temp;
    iVar5 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    dest = puVar1 + (iVar5 << 2);
    iVar5 = (this->super_PalRtCommand)._pitch;
    iVar4 = thread->num_cores;
    puVar1 = (this->super_PalRtCommand)._colormap;
    puVar2 = (this->super_PalRtCommand)._srcblend;
    puVar3 = (this->super_PalRtCommand)._destblend;
    do {
      uVar6 = puVar2[puVar1[*dest]] + puVar3[*_count] & 0x40100400;
      uVar6 = uVar6 - (uVar6 >> 5) |
              puVar2[puVar1[*dest]] + puVar3[*_count] & 0x3fffffff | 0x1f07c1f;
      *_count = RGB32k.All[uVar6 >> 0xf & uVar6];
      uVar6 = puVar2[puVar1[dest[1]]] + puVar3[_count[1]] & 0x40100400;
      uVar6 = uVar6 - (uVar6 >> 5) |
              puVar2[puVar1[dest[1]]] + puVar3[_count[1]] & 0x3fffffff | 0x1f07c1f;
      _count[1] = RGB32k.All[uVar6 >> 0xf & uVar6];
      uVar6 = puVar2[puVar1[dest[2]]] + puVar3[_count[2]] & 0x40100400;
      uVar6 = uVar6 - (uVar6 >> 5) |
              puVar2[puVar1[dest[2]]] + puVar3[_count[2]] & 0x3fffffff | 0x1f07c1f;
      _count[2] = RGB32k.All[uVar6 >> 0xf & uVar6];
      uVar6 = puVar2[puVar1[dest[3]]] + puVar3[_count[3]] & 0x40100400;
      uVar6 = uVar6 - (uVar6 >> 5) |
              puVar2[puVar1[dest[3]]] + puVar3[_count[3]] & 0x3fffffff | 0x1f07c1f;
      _count[3] = RGB32k.All[uVar6 >> 0xf & uVar6];
      dest = dest + 4;
      _count = _count + iVar5 * iVar4;
      fg2rgb._0_4_ = (int)fg2rgb + -1;
    } while ((int)fg2rgb != 0);
  }
  return;
}

Assistant:

void DrawColumnRt4AddClampPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;

		do {
			uint32_t a = fg2rgb[colormap[source[0]]] + bg2rgb[dest[0]];
			uint32_t b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			dest[0] = RGB32k.All[(a>>15) & a];

			a = fg2rgb[colormap[source[1]]] + bg2rgb[dest[1]];
			b = a;
			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			dest[1] = RGB32k.All[(a>>15) & a];

			a = fg2rgb[colormap[source[2]]] + bg2rgb[dest[2]];
			b = a;
			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			dest[2] = RGB32k.All[(a>>15) & a];

			a = fg2rgb[colormap[source[3]]] + bg2rgb[dest[3]];
			b = a;
			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			dest[3] = RGB32k.All[(a>>15) & a];

			source += 4;
			dest += pitch;
		} while (--count);
	}